

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

wchar_t adjust_dam(player *p,wchar_t type,wchar_t dam,_Bool actual)

{
  short sVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int local_34;
  
  local_34 = 0;
  iVar6 = 100;
LAB_001c769e:
  if (p == (player *)0x0) {
    iVar6 = 100;
    iVar5 = 0;
LAB_001c7904:
    if ((L'\x03' < type) && (iVar6 < 0x65)) {
      iVar3 = 100 - iVar6;
      if (iVar6 < 0x33) {
        iVar3 = iVar6;
      }
      iVar3 = (iVar3 << (type == L'\v')) / 10;
      uVar4 = Rand_div(iVar3 * 2 + 1);
      iVar6 = (iVar6 - iVar3) + uVar4;
    }
LAB_001c796c:
    iVar6 = (dam * iVar6 + 99) / 100;
LAB_001c798e:
    return iVar5 + local_34 + iVar6;
  }
  if (p->race == (player_race *)0x0) {
    iVar5 = 0;
LAB_001c78ff:
    if (type != L'\0') goto LAB_001c7904;
    _Var2 = minus_ac(p);
    if (_Var2) {
      dam = (dam - (dam + L'\x01' >> 0x1f)) + 1 >> 1;
    }
    goto LAB_001c796c;
  }
  iVar5 = 0;
  while (type == L'\x15') {
    sVar1 = (p->state).el_info[2].res_level;
    if (actual) {
      equip_learn_element(p,L'\x02');
    }
    dam = dam / 2;
    if (sVar1 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (sVar1 * dam + 99) / 100;
    }
    iVar5 = iVar5 + iVar3;
    type = L'\x04';
    if (p->race == (player_race *)0x0) goto LAB_001c78ff;
  }
  switch(type) {
  case L'\x0e':
    sVar1 = (p->state).el_info[3].res_level;
    if (actual) {
      equip_learn_element(p,L'\x03');
    }
    if (sVar1 != 0) {
      iVar6 = (dam * sVar1 + 99) / 100;
      goto LAB_001c798e;
    }
    break;
  default:
    iVar6 = 100;
    if (L'\x1b' < type) goto LAB_001c7904;
    sVar1 = (p->state).el_info[type].res_level;
    iVar6 = (int)sVar1;
    if (actual) {
      equip_learn_element(p,type);
    }
    if (sVar1 != 0) goto LAB_001c78ff;
    break;
  case L'\x13':
    sVar1 = (p->state).el_info[2].res_level;
    if (actual) {
      equip_learn_element(p,L'\x02');
    }
    if (sVar1 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = ((int)sVar1 * (dam / 2) + 99) / 100;
    }
    if (p->race == (player_race *)0x0) {
      iVar6 = 100;
LAB_001c78c9:
      iVar6 = (iVar6 * (dam / 2) + 99) / 100;
    }
    else {
      sVar1 = (p->state).el_info[1].res_level;
      iVar6 = (int)sVar1;
      if (actual) {
        equip_learn_element(p,L'\x01');
      }
      if (sVar1 != 0) goto LAB_001c78c9;
      iVar6 = 0;
    }
    iVar6 = iVar6 + iVar3;
    goto LAB_001c798e;
  case L'\x14':
    iVar6 = dam / 2;
    goto LAB_001c798e;
  case L'\x16':
    goto switchD_001c7734_caseD_16;
  }
  iVar6 = 0;
  goto LAB_001c798e;
switchD_001c7734_caseD_16:
  sVar1 = (p->state).el_info[2].res_level;
  if (actual) {
    equip_learn_element(p,L'\x02');
  }
  if (sVar1 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (((dam * 2) / 3) * (int)sVar1 + 99) / 100;
  }
  dam = dam / 3;
  local_34 = iVar5 + local_34 + iVar3;
  type = L'\x06';
  goto LAB_001c769e;
}

Assistant:

int adjust_dam(struct player *p, int type, int dam, bool actual)
{
	int dam_percent = 100;

	/* If an actual player exists, get their actual resist */
	if (p && p->race) {
		int special_dam = 0;

		/* Handle special cases */
		if (type == PROJ_ICE) {
			return adjust_dam(p, PROJ_COLD, dam, actual);
		} else if (type == PROJ_PLASMA) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_ELEC, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_STORM) {
			/* Extra storm damage will come later */
			return dam / 2;
		} else if (type == PROJ_DRAGONFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, dam / 2, actual);
			special_dam += adjust_dam(p, PROJ_POIS, dam / 2, actual);
			return special_dam;
		} else if (type == PROJ_HELLFIRE) {
			special_dam = adjust_dam(p, PROJ_FIRE, 2 * dam / 3, actual);
			special_dam += adjust_dam(p, PROJ_DARK, dam / 3, actual);
			return special_dam;
		} else if (type < ELEM_MAX) {
			/* For the regular elements, the stored resistance level is the
			 * percentage of damage taken */
			dam_percent = p->state.el_info[type].res_level;

			/* Notice element stuff */
			if (actual) {
				equip_learn_element(p, type);
			}
		}
	}

	/* Immune */
	if (dam_percent == RES_LEVEL_MAX) return 0;

	/* Acid damage is halved by armour */
	if (type == PROJ_ACID && p && minus_ac(p)) {
		dam = (dam + 1) / 2;
	}

	/* High resists get randomised, especially chaos */
	if ((type >= ELEM_HIGH_MIN) && (dam_percent <= RES_LEVEL_BASE)) {
		/* How far is the closer of zero and 100 */
		int max_range =	dam_percent > 50 ? 100 - dam_percent : dam_percent;

		/* Random range is 1 or 2 times 10% of that range */
		int range = (((type == PROJ_CHAOS) ? 2 : 1) * max_range) / 10;

		/* Randomize */
		dam_percent = dam_percent - range + randint0((2 * range) + 1);
	}

	/* Apply the percentage resistance, rounded up */
	return ((dam * dam_percent) + 99) / 100;
}